

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

bool __thiscall ON_2fVector::Unitize(ON_2fVector *this)

{
  double dVar1;
  ON_2fVector OVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  dVar1 = Length(this);
  if (0.0 < dVar1) {
    auVar3._0_8_ = (double)(*this).x;
    auVar3._8_8_ = (double)(*this).y;
    auVar4._8_8_ = dVar1;
    auVar4._0_8_ = dVar1;
    auVar4 = divpd(auVar3,auVar4);
    OVar2.x = (float)auVar4._0_8_;
    OVar2.y = (float)auVar4._8_8_;
    *this = OVar2;
  }
  return 0.0 < dVar1;
}

Assistant:

bool ON_2fVector::Unitize()
{
  bool rc = false;
  // Since x,y are floats, d will not be denormalized and the
  // ON_DBL_MIN tests in ON_2dVector::Unitize() are not needed.
  double d = Length();
  if ( d > 0.0 ) 
  {
    double dx = (double)x;
    double dy = (double)y;
    x = (float)(dx/d);
    y = (float)(dy/d);
    rc = true;
  }
  return rc;
}